

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu1_init(void *hal,MppHalCfg *cfg)

{
  MPP_RET MVar1;
  void *ptr;
  M2vdVdpu1Reg_t *regs;
  M2vdHalCtx *ctx;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  ptr = mpp_osal_calloc("hal_m2vd_vdpu1_init",0x194);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,"hal_m2vd_vdpu1","failed to malloc register ret\n","hal_m2vd_vdpu1_init");
    ctx._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    *(undefined4 *)((long)hal + 0xa8) = 0x65;
    MVar1 = mpp_dev_init((MppDev *)((long)hal + 0x90),VPU_CLIENT_VDPU1);
    if (MVar1 == MPP_OK) {
      if ((*(long *)((long)hal + 0x70) == 0) &&
         (ctx._4_4_ = mpp_buffer_group_get
                                ((MppBufferGroup *)((long)hal + 0x70),MPP_BUFFER_TYPE_ION,
                                 MPP_BUFFER_INTERNAL,"hal_m2vd_vdpu1","hal_m2vd_vdpu1_init"),
         ctx._4_4_ != MPP_OK)) {
        _mpp_log_l(2,"hal_m2vd_vdpu1","m2v_hal mpp_buffer_group_get failed\n",(char *)0x0);
      }
      else {
        ctx._4_4_ = mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)hal + 0x70),(MppBuffer *)((long)hal + 0x78)
                               ,0x100,"hal_m2vd_vdpu1","hal_m2vd_vdpu1_init");
        if (ctx._4_4_ == MPP_OK) {
          *(MppBufSlots *)((long)hal + 0x58) = cfg->packet_slots;
          *(MppBufSlots *)((long)hal + 0x60) = cfg->frame_slots;
          *(MppCbCtx **)((long)hal + 0x88) = cfg->dec_cb;
          *(void **)((long)hal + 0x68) = ptr;
          cfg->dev = *(MppDev *)((long)hal + 0x90);
          return MPP_OK;
        }
        _mpp_log_l(2,"hal_m2vd_vdpu1","m2v_hal_qtable_base get buffer failed\n",(char *)0x0);
      }
    }
    else {
      _mpp_log_l(2,"hal_m2vd_vdpu1","mpp_dev_init failed. ret: %d\n","hal_m2vd_vdpu1_init",
                 (ulong)(uint)MVar1);
      ctx._4_4_ = MPP_ERR_UNKNOW;
    }
  }
  if (ptr != (void *)0x0) {
    mpp_osal_free("hal_m2vd_vdpu1_init",ptr);
  }
  if (hal != (void *)0x0) {
    hal_m2vd_vdpu1_deinit(hal);
  }
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
    M2vdVdpu1Reg_t *regs = NULL;

    regs = mpp_calloc(M2vdVdpu1Reg_t, 1);
    if (NULL == regs) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto __ERR_RET;
    }

    ctx->reg_len = M2VD_VDPU1_REG_NUM;

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU1);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        ret = MPP_ERR_UNKNOW;
        goto __ERR_RET;
    }
    if (ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("m2v_hal mpp_buffer_group_get failed\n");
            goto __ERR_RET;
        }
    }
    ret = mpp_buffer_get(ctx->group, &ctx->qp_table, M2VD_BUF_SIZE_QPTAB);
    if (ret) {
        mpp_err("m2v_hal_qtable_base get buffer failed\n");
        goto __ERR_RET;
    }

    ctx->packet_slots   = cfg->packet_slots;
    ctx->frame_slots    = cfg->frame_slots;
    ctx->dec_cb         = cfg->dec_cb;
    ctx->regs           = (void*)regs;
    cfg->dev            = ctx->dev;

    return ret;

__ERR_RET:
    if (regs) {
        mpp_free(regs);
        regs = NULL;
    }

    if (ctx) {
        hal_m2vd_vdpu1_deinit(ctx);
    }

    return ret;
}